

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O2

void __thiscall
google::protobuf::util::MessageDifferencer::set_field_comparator
          (MessageDifferencer *this,FieldComparator *comparator)

{
  LogMessage LStack_18;
  
  if (comparator != (FieldComparator *)0x0) {
    this->field_comparator_kind_ = kFCBase;
    (this->field_comparator_).base = comparator;
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer.cc"
             ,0x140,"comparator");
  absl::lts_20250127::log_internal::LogMessage::operator<<
            (&LStack_18,(char (*) [35])"Field comparator can\'t be nullptr.");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_18)
  ;
}

Assistant:

void MessageDifferencer::set_field_comparator(FieldComparator* comparator) {
  ABSL_CHECK(comparator) << "Field comparator can't be nullptr.";
  field_comparator_kind_ = kFCBase;
  field_comparator_.base = comparator;
}